

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O3

void __thiscall amrex::MLCellLinOp::defineAuxData(MLCellLinOp *this)

{
  pointer pVVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer puVar4;
  tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> tVar5;
  int ncomp;
  int iVar6;
  pointer piVar7;
  __uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true> this_00;
  long lVar8;
  Orientation face;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long local_1f8;
  IntVect ratio;
  FabArray<amrex::IArrayBox> local_1b0;
  
  std::
  vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
  ::resize(&(this->m_undrrelxr).
            super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::
  vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
  ::resize(&(this->m_maskvals).
            super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels);
  std::vector<amrex::YAFluxRegister,_std::allocator<amrex::YAFluxRegister>_>::resize
            (&(this->m_fluxreg).
              super_vector<amrex::YAFluxRegister,_std::allocator<amrex::YAFluxRegister>_>,
             (long)(this->super_MLLinOp).m_num_amr_levels - 1);
  std::
  vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::resize(&(this->m_norm_fine_mask).
            super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
           ,(long)(this->super_MLLinOp).m_num_amr_levels - 1);
  ncomp = (*(this->super_MLLinOp)._vptr_MLLinOp[5])(this);
  if (0 < (this->super_MLLinOp).m_num_amr_levels) {
    piVar7 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    local_1f8 = 0;
    do {
      std::vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>::resize
                (&(this->m_undrrelxr).
                  super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_1f8].
                  super_vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,
                 (long)piVar7[local_1f8]);
      piVar7 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (0 < piVar7[local_1f8]) {
        lVar9 = 0;
        lVar11 = 0;
        lVar8 = 0;
        lVar12 = 0;
        do {
          BndryRegister::define
                    ((BndryRegister *)
                     (*(long *)&(this->m_undrrelxr).
                                super_vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_1f8].
                                super_vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                                .
                                super__Vector_base<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>
                     + lVar8),(BoxArray *)
                              (*(long *)&(this->super_MLLinOp).m_grids.
                                         super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                         .
                                         super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[local_1f8].
                                         super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                         .
                                         super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                              + lVar11),
                     (DistributionMapping *)
                     (*(long *)&(this->super_MLLinOp).m_dmap.
                                super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_1f8].
                                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                .
                                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                     + lVar9),1,0,0,ncomp);
          lVar12 = lVar12 + 1;
          piVar7 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          lVar8 = lVar8 + 0x970;
          lVar11 = lVar11 + 0x68;
          lVar9 = lVar9 + 0x10;
        } while (lVar12 < piVar7[local_1f8]);
      }
      local_1f8 = local_1f8 + 1;
      iVar6 = (this->super_MLLinOp).m_num_amr_levels;
    } while (local_1f8 < iVar6);
    if (0 < iVar6) {
      piVar7 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar8 = 0;
      do {
        std::
        vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
        ::resize(&(this->m_maskvals).
                  super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar8].
                  super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                 ,(long)piVar7[lVar8]);
        piVar7 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if (0 < piVar7[lVar8]) {
          lVar9 = 0;
          lVar11 = 0;
          do {
            lVar10 = 0;
            lVar12 = lVar9;
            do {
              iVar6 = (*(this->super_MLLinOp)._vptr_MLLinOp[0x45])(this);
              MultiMask::define((MultiMask *)
                                (*(long *)&(this->m_maskvals).
                                           super_vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                           super_vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                                           .
                                           super__Vector_base<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                                + lVar12),
                                (BoxArray *)
                                (*(long *)&(this->super_MLLinOp).m_grids.
                                           super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                           super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                           .
                                           super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                + lVar11 * 0x68),
                                (DistributionMapping *)
                                (*(long *)&(this->super_MLLinOp).m_dmap.
                                           super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                           .
                                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                + lVar11 * 0x10),
                                (Geometry *)
                                (*(long *)&(this->super_MLLinOp).m_geom.
                                           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                           .
                                           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                           super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                           .
                                           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                + lVar11 * 200),(Orientation)(int)lVar10,0,1,
                                (uint)(byte)((byte)iVar6 ^ 1),1,true);
              lVar10 = lVar10 + 1;
              lVar12 = lVar12 + 0x180;
            } while (lVar10 != 6);
            lVar11 = lVar11 + 1;
            piVar7 = (this->super_MLLinOp).m_num_mg_levels.super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            lVar9 = lVar9 + 0x900;
          } while (lVar11 < piVar7[lVar8]);
        }
        lVar8 = lVar8 + 1;
        iVar6 = (this->super_MLLinOp).m_num_amr_levels;
      } while (lVar8 < iVar6);
      if (1 < iVar6) {
        lVar11 = 0;
        lVar9 = 0;
        lVar8 = 0;
        do {
          ratio.vect[0] =
               (this->super_MLLinOp).m_amr_ref_ratio.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar8];
          lVar12 = lVar8 + 1;
          pVVar1 = (this->super_MLLinOp).m_geom.
                   super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar2 = (this->super_MLLinOp).m_grids.
                   super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pVVar3 = (this->super_MLLinOp).m_dmap.
                   super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ratio.vect[1] = ratio.vect[0];
          ratio.vect[2] = ratio.vect[0];
          YAFluxRegister::define
                    ((YAFluxRegister *)
                     ((long)&(((this->m_fluxreg).
                               super_vector<amrex::YAFluxRegister,_std::allocator<amrex::YAFluxRegister>_>
                               .
                               super__Vector_base<amrex::YAFluxRegister,_std::allocator<amrex::YAFluxRegister>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_crse_data).
                             super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase
                     + lVar9),*(BoxArray **)
                               ((long)&pVVar2[1].
                                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       .
                                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar11),
                     *(BoxArray **)
                      ((long)&(pVVar2->
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar11),
                     *(DistributionMapping **)
                      ((long)&pVVar3[1].
                              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                              .
                              super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11),
                     *(DistributionMapping **)
                      ((long)&(pVVar3->
                              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                              ).
                              super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar11),
                     *(Geometry **)
                      ((long)&pVVar1[1].
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar11),
                     *(Geometry **)
                      ((long)&(pVVar1->
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar11),&ratio,(int)lVar12,
                     ncomp);
          pVVar2 = (this->super_MLLinOp).m_grids.
                   super_vector<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                   .
                   super__Vector_base<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,_std::allocator<amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          makeFineMask((iMultiFab *)&local_1b0,
                       *(BoxArray **)
                        ((long)&(pVVar2->
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar11),
                       *(DistributionMapping **)
                        ((long)&(((this->super_MLLinOp).m_dmap.
                                  super_vector<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                  .
                                  super__Vector_base<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,_std::allocator<amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                ).
                                super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar11),
                       *(BoxArray **)
                        ((long)&pVVar2[1].
                                super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar11),&ratio,1,0);
          this_00.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
          _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
               (__uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>)
               operator_new(0x180);
          FabArray<amrex::IArrayBox>::FabArray
                    ((FabArray<amrex::IArrayBox> *)
                     this_00.
                     super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                     .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,&local_1b0);
          *(undefined ***)
           this_00.super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>.
           _M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
           super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl = &PTR__iMultiFab_00714018;
          puVar4 = (this->m_norm_fine_mask).
                   super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          tVar5.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
          super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
               *(_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_> *)
                &puVar4[lVar8]._M_t.
                 super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>;
          puVar4[lVar8]._M_t.
          super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> =
               this_00.
               super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t.
               super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
               super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl;
          if (tVar5.
              super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
              super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl !=
              (_Head_base<0UL,_amrex::iMultiFab_*,_false>)0x0) {
            (**(code **)(*(long *)tVar5.
                                  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                  .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl + 8
                        ))();
          }
          iMultiFab::~iMultiFab((iMultiFab *)&local_1b0);
          lVar9 = lVar9 + 0x7f0;
          lVar11 = lVar11 + 0x18;
          lVar8 = lVar12;
        } while (lVar12 < (long)(this->super_MLLinOp).m_num_amr_levels + -1);
      }
    }
  }
  return;
}

Assistant:

void
MLCellLinOp::defineAuxData ()
{
    BL_PROFILE("MLCellLinOp::defineAuxData()");

    m_undrrelxr.resize(m_num_amr_levels);
    m_maskvals.resize(m_num_amr_levels);
    m_fluxreg.resize(m_num_amr_levels-1);
    m_norm_fine_mask.resize(m_num_amr_levels-1);

    const int ncomp = getNComp();

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_undrrelxr[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            m_undrrelxr[amrlev][mglev].define(m_grids[amrlev][mglev],
                                              m_dmap[amrlev][mglev],
                                              1, 0, 0, ncomp);
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev)
    {
        m_maskvals[amrlev].resize(m_num_mg_levels[amrlev]);
        for (int mglev = 0; mglev < m_num_mg_levels[amrlev]; ++mglev)
        {
            for (OrientationIter oitr; oitr; ++oitr)
            {
                const Orientation face = oitr();
                const int ngrow = 1;
                const int extent = isCrossStencil() ? 0 : 1; // extend to corners
                m_maskvals[amrlev][mglev][face].define(m_grids[amrlev][mglev],
                                                       m_dmap[amrlev][mglev],
                                                       m_geom[amrlev][mglev],
                                                       face, 0, ngrow, extent, 1, true);
            }
        }
    }

    for (int amrlev = 0; amrlev < m_num_amr_levels-1; ++amrlev)
    {
        const IntVect ratio{m_amr_ref_ratio[amrlev]};
        m_fluxreg[amrlev].define(m_grids[amrlev+1][0], m_grids[amrlev][0],
                                 m_dmap[amrlev+1][0], m_dmap[amrlev][0],
                                 m_geom[amrlev+1][0], m_geom[amrlev][0],
                                 ratio, amrlev+1, ncomp);
        m_norm_fine_mask[amrlev] = std::make_unique<iMultiFab>
            (makeFineMask(m_grids[amrlev][0], m_dmap[amrlev][0], m_grids[amrlev+1][0],
                          ratio, 1, 0));
    }

#if (AMREX_SPACEDIM != 3)
    m_has_metric_term = !m_geom[0][0].IsCartesian() && info.has_metric_term;
#endif
}